

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uo_err.c
# Opt level: O0

void uo_print_err(char *fmt,__va_list_tag *args)

{
  uint __errnum;
  FILE *__stream;
  uint *puVar1;
  char *pcVar2;
  int errno_local;
  __va_list_tag *args_local;
  char *fmt_local;
  
  puVar1 = (uint *)__errno_location();
  __errnum = *puVar1;
  if (fmt != (char *)0x0) {
    vfprintf(_stderr,fmt,args);
    fputc(10,_stderr);
  }
  __stream = _stderr;
  if (__errnum != 0) {
    pcVar2 = strerror(__errnum);
    fprintf(__stream,"(errno = %d) : %s\n",(ulong)__errnum,pcVar2);
  }
  fflush(_stderr);
  return;
}

Assistant:

void uo_print_err(
    const char *fmt,
    va_list args)
{
#ifdef _WIN32
    DWORD winerr = GetLastError();
#endif
    int errno_local = errno;

    if (fmt) 
    {
        vfprintf(stderr, fmt, args);
        fputc('\n', stderr);
    }

    if (errno_local)
        fprintf(stderr, "(errno = %d) : %s\n", errno_local, strerror(errno_local));

#ifdef _WIN32
    if (winerr)
    {
        char buf[256];
        FormatMessage(
            FORMAT_MESSAGE_FROM_SYSTEM | FORMAT_MESSAGE_IGNORE_INSERTS,
            NULL,
            winerr,
            MAKELANGID(LANG_NEUTRAL, SUBLANG_DEFAULT),
            buf, 
            (sizeof buf / sizeof *buf),
            NULL);
        fprintf(stderr, "(GetLastError() = %d) : %s\n", winerr, buf);
    }
#endif

    fflush(stderr);
}